

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassDeserializeBinaryField
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  FieldDescriptor FVar1;
  bool bVar2;
  char *pcVar3;
  FieldDescriptor *pFVar4;
  FieldDescriptor *pFVar5;
  GeneratorOptions *pGVar6;
  long *plVar7;
  string *psVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  GeneratorOptions *extraout_RDX;
  GeneratorOptions *extraout_RDX_00;
  GeneratorOptions *options_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *field_00;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *field_01;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *pFVar10;
  BytesMode in_R8D;
  BytesMode bytes_mode;
  undefined1 in_R9B;
  undefined1 drop_list;
  char **args_3;
  undefined1 in_stack_ffffffffffffff28;
  undefined1 local_d0 [48];
  undefined1 local_a0 [32];
  undefined1 local_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  char *local_60;
  _func_void_FieldDescriptor_ptr *local_58 [2];
  undefined1 local_48 [16];
  FieldDescriptor *local_38;
  
  pFVar4 = (FieldDescriptor *)(local_d0 + 0x10);
  local_d0._0_8_ = pFVar4;
  pcVar3 = FastInt32ToBufferLeft(*(int32 *)(field + 4),(char *)pFVar4);
  local_d0._8_8_ = (long)pcVar3 - (long)pFVar4;
  pFVar5 = (FieldDescriptor *)(local_a0 + 0x10);
  local_a0._0_8_ = pFVar5;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,local_d0._0_8_,(FieldDescriptor *)(local_d0._0_8_ + local_d0._8_8_))
  ;
  io::Printer::Print<char[4],std::__cxx11::string>
            (printer,"    case $num$:\n",(char (*) [4])0x3f0428,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  if ((FieldDescriptor *)local_a0._0_8_ != pFVar5) {
    operator_delete((void *)local_a0._0_8_);
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
    local_a0._0_8_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_d0,
               (FieldDescriptor **)local_a0);
  }
  if ((field[2] == (FieldDescriptor)0xb) &&
     (bVar2 = FieldDescriptor::is_map_message_type(field), bVar2)) {
    pFVar4 = anon_unknown_0::MapFieldKey(field);
    pFVar5 = anon_unknown_0::MapFieldValue(field);
    psVar8 = (string *)local_d0;
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (psVar8,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,(FieldDescriptor *)0x0,
               in_R8D,(bool)in_R9B);
    io::Printer::Print<char[5],std::__cxx11::string>
              (printer,
               "      var value = msg.get$name$();\n      reader.readMessage(value, function(message, reader) {\n"
               ,(char (*) [5])0x3f58c9,psVar8);
    pGVar6 = extraout_RDX;
    if ((FieldDescriptor *)local_d0._0_8_ != (FieldDescriptor *)(local_d0 + 0x10)) {
      operator_delete((void *)local_d0._0_8_);
      pGVar6 = extraout_RDX_00;
    }
    (anonymous_namespace)::JSBinaryReaderMethodName_abi_cxx11_
              ((string *)local_d0,(_anonymous_namespace_ *)pFVar4,pGVar6,(FieldDescriptor *)psVar8);
    (anonymous_namespace)::JSBinaryReaderMethodName_abi_cxx11_
              ((string *)local_a0,(_anonymous_namespace_ *)pFVar5,options_00,
               (FieldDescriptor *)psVar8);
    pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0;
    pFVar10 = (FieldDescriptor *)(local_d0 + 0x10);
    io::Printer::Print<char[12],std::__cxx11::string,char[14],std::__cxx11::string>
              (printer,
               "        jspb.Map.deserializeBinary(message, reader, $keyReaderFn$, $valueReaderFn$",
               (char (*) [12])"keyReaderFn",pbVar9,(char (*) [14])"valueReaderFn",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    if ((FieldDescriptor *)local_a0._0_8_ != (FieldDescriptor *)(local_a0 + 0x10)) {
      operator_delete((void *)local_a0._0_8_);
    }
    if ((FieldDescriptor *)local_d0._0_8_ != pFVar10) {
      operator_delete((void *)local_d0._0_8_);
    }
    if (*(once_flag **)(pFVar5 + 0x18) != (once_flag *)0x0) {
      local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_a0._0_8_ = pFVar5;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar5 + 0x18),(_func_void_FieldDescriptor_ptr **)local_d0,
                 (FieldDescriptor **)local_a0);
    }
    if (pFVar5[2] == (FieldDescriptor)0xb) {
      pGVar6 = (GeneratorOptions *)FieldDescriptor::message_type(pFVar5);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                ((string *)local_d0,(_anonymous_namespace_ *)options,pGVar6,(Descriptor *)pbVar9);
      io::Printer::Print<char[12],std::__cxx11::string>
                (printer,", $messageType$.deserializeBinaryFromReader",(char (*) [12])"messageType",
                 (string *)local_d0);
      field_01 = extraout_RDX_01;
      if ((FieldDescriptor *)local_d0._0_8_ != pFVar10) {
        operator_delete((void *)local_d0._0_8_);
        field_01 = extraout_RDX_02;
      }
    }
    else {
      io::Printer::Print<>(printer,", null");
      field_01 = extraout_RDX_03;
    }
    psVar8 = (string *)local_d0;
    (anonymous_namespace)::JSFieldDefault_abi_cxx11_
              (psVar8,(_anonymous_namespace_ *)pFVar4,field_01);
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,", $defaultKey$",(char (*) [11])"defaultKey",psVar8);
    pFVar4 = extraout_RDX_04;
    if ((FieldDescriptor *)local_d0._0_8_ != pFVar10) {
      operator_delete((void *)local_d0._0_8_);
      pFVar4 = extraout_RDX_05;
    }
    if (*(once_flag **)(pFVar5 + 0x18) != (once_flag *)0x0) {
      local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_a0._0_8_ = pFVar5;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar5 + 0x18),(_func_void_FieldDescriptor_ptr **)local_d0,
                 (FieldDescriptor **)local_a0);
      pFVar4 = extraout_RDX_06;
    }
    if (pFVar5[2] == (FieldDescriptor)0xb) {
      pGVar6 = (GeneratorOptions *)FieldDescriptor::message_type(pFVar5);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                ((string *)local_d0,(_anonymous_namespace_ *)options,pGVar6,(Descriptor *)psVar8);
      io::Printer::Print<char[12],std::__cxx11::string>
                (printer,", new $messageType$()",(char (*) [12])"messageType",(string *)local_d0);
    }
    else {
      (anonymous_namespace)::JSFieldDefault_abi_cxx11_
                ((string *)local_d0,(_anonymous_namespace_ *)pFVar5,pFVar4);
      io::Printer::Print<char[13],std::__cxx11::string>
                (printer,", $defaultValue$",(char (*) [13])"defaultValue",(string *)local_d0);
    }
    if ((FieldDescriptor *)local_d0._0_8_ != pFVar10) {
      operator_delete((void *)local_d0._0_8_);
    }
    io::Printer::Print<>(printer,");\n");
    io::Printer::Print<>(printer,"         });\n");
    goto LAB_0025d482;
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
    local_a0._0_8_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_d0,
               (FieldDescriptor **)local_a0);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) == 10) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              ((string *)local_a0,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)FieldDescriptor::kTypeToCppTypeMap);
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_80._0_8_ = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_d0,
                 (FieldDescriptor **)local_80);
    }
    local_60 = "jspb.Message";
    if (field[2] == (FieldDescriptor)0xa) {
      local_60 = "msgOrGroup";
    }
    local_60 = local_60 + 5;
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_58[0] = FieldDescriptor::TypeOnceInit;
      local_38 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),local_58,&local_38);
    }
    FVar1 = field[2];
    if (FVar1 == (FieldDescriptor)0xa) {
      local_d0._0_8_ = pFVar4;
      pcVar3 = FastInt32ToBufferLeft(*(int32 *)(field + 4),(char *)pFVar4);
      local_d0._8_8_ = (long)pcVar3 - (long)pFVar4;
      local_58[0] = (_func_void_FieldDescriptor_ptr *)local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,local_d0._0_8_,
                 (FieldDescriptor *)(local_d0._0_8_ + local_d0._8_8_));
      plVar7 = (long *)std::__cxx11::string::append((char *)local_58);
      local_80._0_8_ = local_80 + 0x10;
      pFVar10 = (FieldDescriptor *)(plVar7 + 2);
      if ((FieldDescriptor *)*plVar7 == pFVar10) {
        local_70._M_allocated_capacity = *(undefined8 *)pFVar10;
        local_70._8_8_ = plVar7[3];
      }
      else {
        local_70._M_allocated_capacity = *(undefined8 *)pFVar10;
        local_80._0_8_ = (FieldDescriptor *)*plVar7;
      }
      local_80._8_8_ = plVar7[1];
      *plVar7 = (long)pFVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
    }
    else {
      local_80._0_8_ = local_80 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"");
    }
    bytes_mode = 0x3ecf59;
    args_3 = &local_60;
    io::Printer::
    Print<char[11],std::__cxx11::string,char[11],char_const*,char[9],std::__cxx11::string>
              (printer,
               "      var value = new $fieldclass$;\n      reader.read$msgOrGroup$($grpfield$value,$fieldclass$.deserializeBinaryFromReader);\n"
               ,(char (*) [11])"fieldclass",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
               (char (*) [11])"msgOrGroup",args_3,(char (*) [9])"grpfield",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
    drop_list = SUB81(args_3,0);
    if ((FieldDescriptor *)local_80._0_8_ != (FieldDescriptor *)(local_80 + 0x10)) {
      operator_delete((void *)local_80._0_8_);
    }
    if ((FVar1 == (FieldDescriptor)0xa) &&
       (local_58[0] != (_func_void_FieldDescriptor_ptr *)local_48)) {
      operator_delete(local_58[0]);
    }
    pFVar10 = (FieldDescriptor *)local_a0._0_8_;
    if ((FieldDescriptor *)local_a0._0_8_ != pFVar5) {
LAB_0025d37f:
      operator_delete(pFVar10);
    }
  }
  else {
    if ((~(byte)field[1] & 0x60) == 0) {
      if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
        local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
        local_a0._0_8_ = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_d0,
                   (FieldDescriptor **)local_a0);
      }
      if (0xfffffffb < (byte)field[2] - 0xd) goto LAB_0025d140;
      (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
                ((string *)local_d0,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                 (FieldDescriptor *)0x0,true,false,true,BYTES_DEFAULT,
                 (bool)in_stack_ffffffffffffff28);
      (anonymous_namespace)::JSBinaryReaderMethodType_abi_cxx11_
                ((string *)local_a0,(_anonymous_namespace_ *)field,field_00);
      bytes_mode = 0x41a811;
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
      io::Printer::Print<char[10],std::__cxx11::string,char[7],std::__cxx11::string>
                (printer,
                 "      var values = /** @type {$fieldtype$} */ (reader.isDelimited() ? reader.readPacked$reader$() : [reader.read$reader$()]);\n"
                 ,(char (*) [10])"fieldtype",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 (char (*) [7])0x41a811,pbVar9);
      drop_list = SUB81(pbVar9,0);
      pFVar10 = (FieldDescriptor *)local_d0._0_8_;
      if ((FieldDescriptor *)local_a0._0_8_ != pFVar5) {
        operator_delete((void *)local_a0._0_8_);
        pFVar10 = (FieldDescriptor *)local_d0._0_8_;
      }
    }
    else {
LAB_0025d140:
      bVar2 = false;
      (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
                ((string *)local_d0,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                 (FieldDescriptor *)0x0,true,true,true,BYTES_DEFAULT,(bool)in_stack_ffffffffffffff28
                );
      (anonymous_namespace)::JSBinaryReadWriteMethodName_abi_cxx11_
                ((string *)local_a0,(_anonymous_namespace_ *)field,(FieldDescriptor *)0x0,bVar2);
      bytes_mode = 0x41a811;
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
      io::Printer::Print<char[10],std::__cxx11::string,char[7],std::__cxx11::string>
                (printer,"      var value = /** @type {$fieldtype$} */ (reader.read$reader$());\n",
                 (char (*) [10])"fieldtype",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 (char (*) [7])0x41a811,pbVar9);
      drop_list = SUB81(pbVar9,0);
      pFVar10 = (FieldDescriptor *)local_d0._0_8_;
      if ((FieldDescriptor *)local_a0._0_8_ != pFVar5) {
        operator_delete((void *)local_a0._0_8_);
        pFVar10 = (FieldDescriptor *)local_d0._0_8_;
      }
    }
    local_d0._0_8_ = pFVar10;
    if (pFVar10 != pFVar4) goto LAB_0025d37f;
  }
  if ((~(byte)field[1] & 0x60) == 0) {
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_a0._0_8_ = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_d0,
                 (FieldDescriptor **)local_a0);
    }
    if (0xfffffffb < (byte)field[2] - 0xd) goto LAB_0025d400;
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              ((string *)local_d0,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x1,bytes_mode,(bool)drop_list);
    io::Printer::Print<char[5],std::__cxx11::string>
              (printer,
               "      for (var i = 0; i < values.length; i++) {\n        msg.add$name$(values[i]);\n      }\n"
               ,(char (*) [5])0x3f58c9,(string *)local_d0);
  }
  else {
LAB_0025d400:
    if ((~(byte)field[1] & 0x60) == 0) {
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                ((string *)local_d0,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
                 (FieldDescriptor *)0x1,bytes_mode,(bool)drop_list);
      io::Printer::Print<char[5],std::__cxx11::string>
                (printer,"      msg.add$name$(value);\n",(char (*) [5])0x3f58c9,(string *)local_d0);
    }
    else {
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                ((string *)local_d0,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
                 (FieldDescriptor *)0x0,bytes_mode,(bool)drop_list);
      io::Printer::Print<char[5],std::__cxx11::string>
                (printer,"      msg.set$name$(value);\n",(char (*) [5])0x3f58c9,(string *)local_d0);
    }
  }
  if ((FieldDescriptor *)local_d0._0_8_ != pFVar4) {
    operator_delete((void *)local_d0._0_8_);
  }
LAB_0025d482:
  io::Printer::Print<>(printer,"      break;\n");
  return;
}

Assistant:

void Generator::GenerateClassDeserializeBinaryField(
    const GeneratorOptions& options, io::Printer* printer,
    const FieldDescriptor* field) const {
  printer->Print("    case $num$:\n", "num", StrCat(field->number()));

  if (field->is_map()) {
    const FieldDescriptor* key_field = MapFieldKey(field);
    const FieldDescriptor* value_field = MapFieldValue(field);
    printer->Print(
        "      var value = msg.get$name$();\n"
        "      reader.readMessage(value, function(message, reader) {\n",
        "name", JSGetterName(options, field));

    printer->Print(
        "        jspb.Map.deserializeBinary(message, reader, "
        "$keyReaderFn$, $valueReaderFn$",
        "keyReaderFn", JSBinaryReaderMethodName(options, key_field),
        "valueReaderFn", JSBinaryReaderMethodName(options, value_field));

    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      printer->Print(", $messageType$.deserializeBinaryFromReader",
                     "messageType",
                     GetMessagePath(options, value_field->message_type()));
    } else {
      printer->Print(", null");
    }
    printer->Print(", $defaultKey$", "defaultKey", JSFieldDefault(key_field));
    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      printer->Print(", new $messageType$()", "messageType",
                     GetMessagePath(options, value_field->message_type()));
    } else {
      printer->Print(", $defaultValue$", "defaultValue",
                     JSFieldDefault(value_field));
    }
    printer->Print(");\n");
    printer->Print("         });\n");
  } else {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
          "      var value = new $fieldclass$;\n"
          "      reader.read$msgOrGroup$($grpfield$value,"
          "$fieldclass$.deserializeBinaryFromReader);\n",
          "fieldclass", SubmessageTypeRef(options, field), "msgOrGroup",
          (field->type() == FieldDescriptor::TYPE_GROUP) ? "Group" : "Message",
          "grpfield",
          (field->type() == FieldDescriptor::TYPE_GROUP)
              ? (StrCat(field->number()) + ", ")
              : "");
    } else if (field->is_packable()) {
      printer->Print(
          "      var values = /** @type {$fieldtype$} */ "
          "(reader.isDelimited() "
          "? reader.readPacked$reader$() : [reader.read$reader$()]);\n",
          "fieldtype",
          JSFieldTypeAnnotation(options, field, false, true,
                                /* singular_if_not_packed */ false, BYTES_U8),
          "reader", JSBinaryReaderMethodType(field));
    } else {
      printer->Print(
          "      var value = /** @type {$fieldtype$} */ "
          "(reader.read$reader$());\n",
          "fieldtype",
          JSFieldTypeAnnotation(options, field, false, true,
                                /* singular_if_not_packed */ true, BYTES_U8),
          "reader",
          JSBinaryReadWriteMethodName(field, /* is_writer = */ false));
    }

    if (field->is_packable()) {
      printer->Print(
          "      for (var i = 0; i < values.length; i++) {\n"
          "        msg.add$name$(values[i]);\n"
          "      }\n",
          "name",
          JSGetterName(options, field, BYTES_DEFAULT, /* drop_list = */ true));
    } else if (field->is_repeated()) {
      printer->Print(
          "      msg.add$name$(value);\n", "name",
          JSGetterName(options, field, BYTES_DEFAULT, /* drop_list = */ true));
    } else {
      // Singular fields, and packed repeated fields, receive a |value| either
      // as the field's value or as the array of all the field's values; set
      // this as the field's value directly.
      printer->Print("      msg.set$name$(value);\n", "name",
                     JSGetterName(options, field));
    }
  }

  printer->Print("      break;\n");
}